

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMatePlane::Initialize
          (ChLinkMatePlane *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpt1,
          ChVector<double> *mpt2,ChVector<double> mnorm1,ChVector<double> mnorm2)

{
  shared_ptr<chrono::ChBodyFrame> local_88;
  shared_ptr<chrono::ChBodyFrame> local_78;
  ChVector<double> local_68;
  ChVector<double> local_50;
  ChVector<double> local_38;
  ChVector<double> local_20;
  
  local_50.m_data[0] = *(double *)mnorm1.m_data[0];
  if (this->flipped == false) {
    local_50.m_data[0] = -local_50.m_data[0];
    local_50.m_data[1] = -*(double *)((long)mnorm1.m_data[0] + 8);
    local_50.m_data[2] = -*(double *)((long)mnorm1.m_data[0] + 0x10);
  }
  else {
    local_50.m_data[1] = *(double *)((long)mnorm1.m_data[0] + 8);
    local_50.m_data[2] = *(double *)((long)mnorm1.m_data[0] + 0x10);
  }
  local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  local_20.m_data[0] = mpt1->m_data[0];
  local_20.m_data[1] = mpt1->m_data[1];
  local_20.m_data[2] = mpt1->m_data[2];
  local_38.m_data[0] = mpt2->m_data[0];
  local_38.m_data[1] = mpt2->m_data[1];
  local_38.m_data[2] = mpt2->m_data[2];
  local_68.m_data[0] = *(double *)mnorm1.m_data[1];
  local_68.m_data[1] = *(double *)((long)mnorm1.m_data[1] + 8);
  local_68.m_data[2] = *(double *)((long)mnorm1.m_data[1] + 0x10);
  ChLinkMateGeneric::Initialize
            (&this->super_ChLinkMateGeneric,&local_78,&local_88,pos_are_relative,&local_20,&local_38
             ,&local_50,&local_68);
  if (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChLinkMatePlane::Initialize(std::shared_ptr<ChBodyFrame> mbody1, 
                                 std::shared_ptr<ChBodyFrame> mbody2,
                                 bool pos_are_relative, 
                                 ChVector<> mpt1,
                                 ChVector<> mpt2,
                                 ChVector<> mnorm1,
                                 ChVector<> mnorm2) {
    // set the two frames so that they have the X axis aligned when the
    // two normals are opposed (default behavior, otherwise is considered 'flipped')

    ChVector<> mnorm1_reversed;
    if (!flipped)
        mnorm1_reversed = -mnorm1;
    else
        mnorm1_reversed = mnorm1;

    ChLinkMateGeneric::Initialize(mbody1, mbody2, pos_are_relative, mpt1, mpt2, mnorm1_reversed, mnorm2);
}